

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_target_env.cpp
# Opt level: O1

char * spvTargetEnvDescription(spv_target_env env)

{
  char *pcVar1;
  
  switch(env) {
  case SPV_ENV_UNIVERSAL_1_0:
    pcVar1 = "SPIR-V 1.0";
    break;
  case SPV_ENV_VULKAN_1_0:
    pcVar1 = "SPIR-V 1.0 (under Vulkan 1.0 semantics)";
    break;
  case SPV_ENV_UNIVERSAL_1_1:
    pcVar1 = "SPIR-V 1.1";
    break;
  case SPV_ENV_OPENCL_2_1:
    pcVar1 = "SPIR-V 1.0 (under OpenCL 2.1 Full Profile semantics)";
    break;
  case SPV_ENV_OPENCL_2_2:
    pcVar1 = "SPIR-V 1.2 (under OpenCL 2.2 Full Profile semantics)";
    break;
  case SPV_ENV_OPENGL_4_0:
    pcVar1 = "SPIR-V 1.0 (under OpenGL 4.0 semantics)";
    break;
  case SPV_ENV_OPENGL_4_1:
    pcVar1 = "SPIR-V 1.0 (under OpenGL 4.1 semantics)";
    break;
  case SPV_ENV_OPENGL_4_2:
    pcVar1 = "SPIR-V 1.0 (under OpenGL 4.2 semantics)";
    break;
  case SPV_ENV_OPENGL_4_3:
    pcVar1 = "SPIR-V 1.0 (under OpenGL 4.3 semantics)";
    break;
  case SPV_ENV_OPENGL_4_5:
    pcVar1 = "SPIR-V 1.0 (under OpenGL 4.5 semantics)";
    break;
  case SPV_ENV_UNIVERSAL_1_2:
    pcVar1 = "SPIR-V 1.2";
    break;
  case SPV_ENV_OPENCL_1_2:
    pcVar1 = "SPIR-V 1.0 (under OpenCL 1.2 Full Profile semantics)";
    break;
  case SPV_ENV_OPENCL_EMBEDDED_1_2:
    pcVar1 = "SPIR-V 1.0 (under OpenCL 1.2 Embedded Profile semantics)";
    break;
  case SPV_ENV_OPENCL_2_0:
    pcVar1 = "SPIR-V 1.0 (under OpenCL 2.0 Full Profile semantics)";
    break;
  case SPV_ENV_OPENCL_EMBEDDED_2_0:
    pcVar1 = "SPIR-V 1.0 (under OpenCL 2.0 Embedded Profile semantics)";
    break;
  case SPV_ENV_OPENCL_EMBEDDED_2_1:
    pcVar1 = "SPIR-V 1.0 (under OpenCL 2.1 Embedded Profile semantics)";
    break;
  case SPV_ENV_OPENCL_EMBEDDED_2_2:
    pcVar1 = "SPIR-V 1.2 (under OpenCL 2.2 Embedded Profile semantics)";
    break;
  case SPV_ENV_UNIVERSAL_1_3:
    pcVar1 = "SPIR-V 1.3";
    break;
  case SPV_ENV_VULKAN_1_1:
    pcVar1 = "SPIR-V 1.3 (under Vulkan 1.1 semantics)";
    break;
  case SPV_ENV_WEBGPU_0:
    __assert_fail("false && \"Deprecated target environment value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/spirv_target_env.cpp"
                  ,0x42,"const char *spvTargetEnvDescription(spv_target_env)");
  case SPV_ENV_UNIVERSAL_1_4:
    pcVar1 = "SPIR-V 1.4";
    break;
  case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
    pcVar1 = "SPIR-V 1.4 (under Vulkan 1.1 semantics)";
    break;
  case SPV_ENV_UNIVERSAL_1_5:
    pcVar1 = "SPIR-V 1.5";
    break;
  case SPV_ENV_VULKAN_1_2:
    pcVar1 = "SPIR-V 1.5 (under Vulkan 1.2 semantics)";
    break;
  case SPV_ENV_UNIVERSAL_1_6:
    pcVar1 = "SPIR-V 1.6";
    break;
  case SPV_ENV_VULKAN_1_3:
    pcVar1 = "SPIR-V 1.6 (under Vulkan 1.3 semantics)";
    break;
  case SPV_ENV_MAX:
    __assert_fail("false && \"Invalid target environment value.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/spirv_target_env.cpp"
                  ,0x51,"const char *spvTargetEnvDescription(spv_target_env)");
  default:
    pcVar1 = "";
  }
  return pcVar1;
}

Assistant:

const char* spvTargetEnvDescription(spv_target_env env) {
  switch (env) {
    case SPV_ENV_UNIVERSAL_1_0:
      return "SPIR-V 1.0";
    case SPV_ENV_VULKAN_1_0:
      return "SPIR-V 1.0 (under Vulkan 1.0 semantics)";
    case SPV_ENV_UNIVERSAL_1_1:
      return "SPIR-V 1.1";
    case SPV_ENV_OPENCL_1_2:
      return "SPIR-V 1.0 (under OpenCL 1.2 Full Profile semantics)";
    case SPV_ENV_OPENCL_EMBEDDED_1_2:
      return "SPIR-V 1.0 (under OpenCL 1.2 Embedded Profile semantics)";
    case SPV_ENV_OPENCL_2_0:
      return "SPIR-V 1.0 (under OpenCL 2.0 Full Profile semantics)";
    case SPV_ENV_OPENCL_EMBEDDED_2_0:
      return "SPIR-V 1.0 (under OpenCL 2.0 Embedded Profile semantics)";
    case SPV_ENV_OPENCL_2_1:
      return "SPIR-V 1.0 (under OpenCL 2.1 Full Profile semantics)";
    case SPV_ENV_OPENCL_EMBEDDED_2_1:
      return "SPIR-V 1.0 (under OpenCL 2.1 Embedded Profile semantics)";
    case SPV_ENV_OPENCL_2_2:
      return "SPIR-V 1.2 (under OpenCL 2.2 Full Profile semantics)";
    case SPV_ENV_OPENCL_EMBEDDED_2_2:
      return "SPIR-V 1.2 (under OpenCL 2.2 Embedded Profile semantics)";
    case SPV_ENV_OPENGL_4_0:
      return "SPIR-V 1.0 (under OpenGL 4.0 semantics)";
    case SPV_ENV_OPENGL_4_1:
      return "SPIR-V 1.0 (under OpenGL 4.1 semantics)";
    case SPV_ENV_OPENGL_4_2:
      return "SPIR-V 1.0 (under OpenGL 4.2 semantics)";
    case SPV_ENV_OPENGL_4_3:
      return "SPIR-V 1.0 (under OpenGL 4.3 semantics)";
    case SPV_ENV_OPENGL_4_5:
      return "SPIR-V 1.0 (under OpenGL 4.5 semantics)";
    case SPV_ENV_UNIVERSAL_1_2:
      return "SPIR-V 1.2";
    case SPV_ENV_UNIVERSAL_1_3:
      return "SPIR-V 1.3";
    case SPV_ENV_VULKAN_1_1:
      return "SPIR-V 1.3 (under Vulkan 1.1 semantics)";
    case SPV_ENV_WEBGPU_0:
      assert(false && "Deprecated target environment value.");
      break;
    case SPV_ENV_UNIVERSAL_1_4:
      return "SPIR-V 1.4";
    case SPV_ENV_VULKAN_1_1_SPIRV_1_4:
      return "SPIR-V 1.4 (under Vulkan 1.1 semantics)";
    case SPV_ENV_UNIVERSAL_1_5:
      return "SPIR-V 1.5";
    case SPV_ENV_VULKAN_1_2:
      return "SPIR-V 1.5 (under Vulkan 1.2 semantics)";
    case SPV_ENV_UNIVERSAL_1_6:
      return "SPIR-V 1.6";
    case SPV_ENV_VULKAN_1_3:
      return "SPIR-V 1.6 (under Vulkan 1.3 semantics)";
    case SPV_ENV_MAX:
      assert(false && "Invalid target environment value.");
      break;
  }
  return "";
}